

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O3

void readBup<BupHeaderSwitch>(istream *stream,BupHeader *header)

{
  pointer this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pBVar2;
  bool bVar3;
  char cVar4;
  size_t len;
  endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *peVar5;
  ostream *poVar6;
  long *plVar7;
  size_t i;
  long lVar8;
  ulong uVar9;
  size_type *psVar10;
  ulong __val;
  char cVar11;
  BupChunk *chunk;
  pointer pBVar12;
  pointer pBVar13;
  string __str;
  BupChunkSwitch t_1;
  BupHeaderSwitch h;
  long *local_e8;
  uint local_e0;
  long local_d8 [2];
  string local_c8;
  istream *local_a8;
  BupChunk local_a0 [5];
  uint32_t local_8c;
  undefined1 local_84 [24];
  endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> local_6c [6];
  undefined1 local_54 [12];
  undefined8 local_48;
  uint local_3c;
  uint local_38;
  
  header->isSwitch = true;
  std::istream::read((char *)stream,(long)local_54);
  header->ew = (undefined2)local_48;
  header->eh = local_48._2_2_;
  header->width = local_48._4_2_;
  header->height = local_48._6_2_;
  std::vector<BupChunk,_std::allocator<BupChunk>_>::resize(&header->chunks,(ulong)local_3c);
  std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::resize
            (&header->expChunks,(ulong)local_38);
  std::istream::ignore((long)stream);
  pBVar12 = (header->chunks).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
            super__Vector_impl_data._M_start;
  pBVar2 = (header->chunks).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar12 != pBVar2) {
    do {
      std::istream::read((char *)stream,(long)local_a0);
      pBVar12->offset = local_a0[0].offset;
      pBVar12 = pBVar12 + 1;
    } while (pBVar12 != pBVar2);
  }
  local_a8 = stream;
  std::istream::ignore((long)stream);
  pBVar13 = (header->expChunks).
            super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((header->expChunks).
      super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar13) {
    paVar1 = &local_c8.field_2;
    __val = 0;
    do {
      this = pBVar13 + __val;
      std::istream::read((char *)local_a8,(long)local_a0);
      pBVar13[__val].face.offset = local_8c;
      std::vector<BupChunk,_std::allocator<BupChunk>_>::resize(&pBVar13[__val].mouths,3);
      pBVar12 = pBVar13[__val].mouths.super__Vector_base<BupChunk,_std::allocator<BupChunk>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        pBVar12[lVar8].offset = *(uint32_t *)local_6c[lVar8 * 2].value_;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      len = strnlen((char *)local_a0,0x14);
      iconv_convert_abi_cxx11_(&local_c8,(char *)local_a0,len,iconv_toutf);
      std::__cxx11::string::operator=((string *)this,(string *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      peVar5 = std::
               __find_if<boost::endian::endian_buffer<(boost::endian::order)1,unsigned_int,32ul,(boost::endian::align)0>const*,__gnu_cxx::__ops::_Iter_negate<allZero<std::array<boost::endian::endian_buffer<(boost::endian::order)1,unsigned_int,32ul,(boost::endian::align)0>,6ul>>(std::array<boost::endian::endian_buffer<(boost::endian::order)1,unsigned_int,32ul,(boost::endian::align)0>,6ul>const&)::_lambda(boost::endian::endian_buffer<(boost::endian::order)1,unsigned_int,32ul,(boost::endian::align)0>)_1_>>
                         (local_84,local_6c);
      if (peVar5 != local_6c) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Expression ",0xb);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,", had unexpected nonzero values in its expression data...",0x39);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      if ((this->name)._M_string_length == 0) {
        cVar11 = '\x01';
        if (9 < __val) {
          uVar9 = __val;
          cVar4 = '\x04';
          do {
            cVar11 = cVar4;
            if (uVar9 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_0010b1ec;
            }
            if (uVar9 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_0010b1ec;
            }
            if (uVar9 < 10000) goto LAB_0010b1ec;
            bVar3 = 99999 < uVar9;
            uVar9 = uVar9 / 10000;
            cVar4 = cVar11 + '\x04';
          } while (bVar3);
          cVar11 = cVar11 + '\x01';
        }
LAB_0010b1ec:
        local_e8 = local_d8;
        std::__cxx11::string::_M_construct((ulong)&local_e8,cVar11);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8,local_e0,__val);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,0x1166e8);
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c8.field_2._M_allocated_capacity = *psVar10;
          local_c8.field_2._8_8_ = plVar7[3];
          local_c8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar10;
          local_c8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_c8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)this,(string *)&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (local_e8 != local_d8) {
          operator_delete(local_e8,local_d8[0] + 1);
        }
      }
      __val = __val + 1;
      pBVar13 = (header->expChunks).
                super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (__val < (ulong)((long)(header->expChunks).
                                   super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar13 >> 6))
    ;
  }
  return;
}

Assistant:

void readBup(std::istream& stream, BupHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	copyTo(header, h);

	// Skip bytes for unknown reason
	stream.ignore(h.tbl1.value() * h.skipAmount);

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		copyTo(chunk, c);
	}

	stream.ignore(h.skipAmount2);

	for (size_t i = 0; i < header.expChunks.size(); i++) {
		auto& expChunk = header.expChunks[i];

		auto c = readRaw<typename Header::ExpressionChunk>(stream);
		copyTo(expChunk, c);
		expChunk.name = toUTF8(c.name, strnlen(c.name, sizeof(c.name)));

		if (!c.unkBytesValid()) {
			std::cerr << "Expression " << i << ", " << expChunk.name << ", had unexpected nonzero values in its expression data..." << std::endl;
		}

		if (expChunk.name.empty()) {
			expChunk.name = "expression" + std::to_string(i);
		}
	}
}